

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::AttConfig::endAddAttachment(AttConfig *this)

{
  Config *pCVar1;
  int iVar2;
  QPDFTime *qtm;
  string last_element;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (endAddAttachment()::now_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&endAddAttachment()::now_abi_cxx11_);
    if (iVar2 != 0) {
      QUtil::get_current_qpdf_time();
      QUtil::qpdf_time_to_pdf_time_abi_cxx11_
                (&endAddAttachment()::now_abi_cxx11_,(QUtil *)&local_58,qtm);
      __cxa_atexit(std::__cxx11::string::~string,&endAddAttachment()::now_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&endAddAttachment()::now_abi_cxx11_);
    }
  }
  if ((this->att).path._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"add attachment: no file specified",(allocator<char> *)&local_38)
    ;
    usage(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  QUtil::path_basename(&local_58,&(this->att).path);
  if (local_58._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"file for --add-attachment may not be empty",&local_59);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((this->att).filename._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).filename);
  }
  if ((this->att).key._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).key);
  }
  if ((this->att).creationdate._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).creationdate);
  }
  if ((this->att).moddate._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).moddate);
  }
  std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::push_back
            (&((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->attachments_to_add,&this->att);
  pCVar1 = this->config;
  std::__cxx11::string::~string((string *)&local_58);
  return pCVar1;
}

Assistant:

QPDFJob::Config*
QPDFJob::AttConfig::endAddAttachment()
{
    static std::string now = QUtil::qpdf_time_to_pdf_time(QUtil::get_current_qpdf_time());
    if (this->att.path.empty()) {
        usage("add attachment: no file specified");
    }
    std::string last_element = QUtil::path_basename(this->att.path);
    if (last_element.empty()) {
        usage("file for --add-attachment may not be empty");
    }
    if (this->att.filename.empty()) {
        this->att.filename = last_element;
    }
    if (this->att.key.empty()) {
        this->att.key = last_element;
    }
    if (this->att.creationdate.empty()) {
        this->att.creationdate = now;
    }
    if (this->att.moddate.empty()) {
        this->att.moddate = now;
    }

    this->config->o.m->attachments_to_add.push_back(this->att);
    return this->config;
}